

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O1

int nes_pack_8x8_tile(uchar *buffer,void *data,int line_offset,int format)

{
  long lVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  char *stptr;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  
  if (pass == 1) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    if (format == 1) {
      lVar1 = 0;
      do {
        bVar5 = buffer[lVar1];
        bVar6 = buffer[lVar1 + 8];
        uVar7 = 0;
        do {
          bVar8 = *(byte *)((long)data + ((ulong)uVar7 ^ 7));
          bVar4 = (byte)(1 << ((byte)uVar7 & 0x1f));
          bVar9 = bVar8 & 1;
          if ((bVar8 & 1) != 0) {
            bVar9 = bVar4;
          }
          bVar5 = bVar5 | bVar9;
          buffer[lVar1] = bVar5;
          bVar9 = bVar8 & 2;
          if ((bVar8 & 2) != 0) {
            bVar9 = bVar4;
          }
          bVar6 = bVar6 | bVar9;
          buffer[lVar1 + 8] = bVar6;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 8);
        data = (void *)((long)data + (long)line_offset);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 8);
    }
    else {
      if (format == 2) {
        lVar1 = 0;
        iVar3 = 0;
        do {
          uVar7 = *(uint *)((long)data + lVar1 * 4);
          bVar5 = buffer[lVar1];
          bVar6 = buffer[lVar1 + 8];
          iVar2 = 0;
          do {
            iVar3 = (iVar3 + 1) - (uint)((uVar7 & 0xc) == 0);
            bVar9 = (byte)(1 << ((byte)iVar2 & 0x1f));
            bVar8 = (byte)(uVar7 & 1);
            if ((uVar7 & 1) != 0) {
              bVar8 = bVar9;
            }
            bVar5 = bVar5 | bVar8;
            bVar8 = (byte)(uVar7 & 2);
            if ((uVar7 & 2) != 0) {
              bVar8 = bVar9;
            }
            bVar6 = bVar6 | bVar8;
            uVar7 = uVar7 >> 4;
            iVar2 = iVar2 + 1;
          } while (iVar2 != 8);
          buffer[lVar1] = bVar5;
          buffer[lVar1 + 8] = bVar6;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 8);
        if (iVar3 == 0) {
          return 0x10;
        }
        stptr = "Incorrect pixel color index!";
      }
      else {
        stptr = "Internal error: unsupported format passed to \'pack_8x8_tile\'!";
      }
      error(stptr);
    }
  }
  return 0x10;
}

Assistant:

int
nes_pack_8x8_tile(unsigned char *buffer, void *data, int line_offset, int format)
{
	int i, j;
	int cnt, err;
	unsigned int   pixel;
	unsigned char *ptr;
	unsigned int  *packed;

	/* pack the tile only in the last pass */
	if (pass != LAST_PASS)
		return (16);

	/* clear buffer */
	memset(buffer, 0, 16);

	/* encode the tile */
	switch (format) {
	case CHUNKY_TILE:
		/* 8-bit chunky format */
		cnt = 0;
		ptr = data;

		for (i = 0; i < 8; i++) {
			for (j = 0; j < 8; j++) {
				pixel = ptr[j ^ 0x07];
				buffer[cnt]   |= (pixel & 0x01) ? (1 << j) : 0;
				buffer[cnt+8] |= (pixel & 0x02) ? (1 << j) : 0;
			}				
			ptr += line_offset;
			cnt += 1;
		}
		break;

	case PACKED_TILE:
		/* 4-bit packed format */
		cnt = 0;
		err = 0;
		packed = data;
	
		for (i = 0; i < 8; i++) {
			pixel = packed[i];
	
			for (j = 0; j < 8; j++) {
				/* check for errors */
				if (pixel & 0x0C)
					err++;

				/* convert the tile */
				buffer[cnt]   |= (pixel & 0x01) ? (1 << j) : 0;
				buffer[cnt+8] |= (pixel & 0x02) ? (1 << j) : 0;
				pixel >>= 4;
			}
			cnt += 1;
		}

		/* error message */
		if (err)
			error("Incorrect pixel color index!");
		break;

	default:
		/* other formats not supported */
		error("Internal error: unsupported format passed to 'pack_8x8_tile'!");
		break;
	}

	/* ok */
	return (16);
}